

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O0

MESSAGE_HANDLE message_clone(MESSAGE_HANDLE source_message)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  LOGGER_LOG p_Var3;
  HEADER_HANDLE pHVar4;
  AMQP_VALUE pAVar5;
  PROPERTIES_HANDLE pPVar6;
  void *pvVar7;
  size_t local_d0;
  size_t local_c8;
  size_t local_c0;
  size_t local_b8;
  LOGGER_LOG l_14;
  LOGGER_LOG l_13;
  size_t i_1;
  LOGGER_LOG l_12;
  LOGGER_LOG l_11;
  size_t calloc_size_1;
  LOGGER_LOG l_10;
  size_t i;
  LOGGER_LOG l_9;
  LOGGER_LOG l_8;
  size_t calloc_size;
  LOGGER_LOG l_7;
  LOGGER_LOG l_6;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  MESSAGE_HANDLE result;
  MESSAGE_HANDLE source_message_local;
  
  if (source_message == (MESSAGE_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message.c"
                ,"message_clone",0x8c,1,"NULL source_message");
    }
    l = (LOGGER_LOG)0x0;
  }
  else {
    l = (LOGGER_LOG)message_create();
    if ((MESSAGE_HANDLE)l == (MESSAGE_HANDLE)0x0) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message.c"
                  ,"message_clone",0x96,1,"Cannot clone message");
      }
    }
    else {
      ((MESSAGE_HANDLE)l)->message_format = source_message->message_format;
      if (source_message->header != (HEADER_HANDLE)0x0) {
        pHVar4 = header_clone(source_message->header);
        ((MESSAGE_HANDLE)l)->header = pHVar4;
        if (((MESSAGE_HANDLE)l)->header == (HEADER_HANDLE)0x0) {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message.c"
                      ,"message_clone",0xa3,1,"Cannot clone message header");
          }
          message_destroy((MESSAGE_HANDLE)l);
          l = (LOGGER_LOG)0x0;
        }
      }
      if ((l != (LOGGER_LOG)0x0) &&
         (source_message->delivery_annotations != (delivery_annotations)0x0)) {
        pAVar5 = amqpvalue_clone(source_message->delivery_annotations);
        *(AMQP_VALUE *)(l + 0x30) = pAVar5;
        if (*(long *)(l + 0x30) == 0) {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message.c"
                      ,"message_clone",0xb0,1,"Cannot clone delivery annotations");
          }
          message_destroy((MESSAGE_HANDLE)l);
          l = (LOGGER_LOG)0x0;
        }
      }
      if ((l != (LOGGER_LOG)0x0) &&
         (source_message->message_annotations != (message_annotations)0x0)) {
        pAVar5 = amqpvalue_clone(source_message->message_annotations);
        *(AMQP_VALUE *)(l + 0x38) = pAVar5;
        if (*(long *)(l + 0x38) == 0) {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message.c"
                      ,"message_clone",0xbd,1,"Cannot clone message annotations");
          }
          message_destroy((MESSAGE_HANDLE)l);
          l = (LOGGER_LOG)0x0;
        }
      }
      if ((l != (LOGGER_LOG)0x0) && (source_message->properties != (PROPERTIES_HANDLE)0x0)) {
        pPVar6 = properties_clone(source_message->properties);
        *(PROPERTIES_HANDLE *)(l + 0x40) = pPVar6;
        if (*(long *)(l + 0x40) == 0) {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message.c"
                      ,"message_clone",0xca,1,"Cannot clone message properties");
          }
          message_destroy((MESSAGE_HANDLE)l);
          l = (LOGGER_LOG)0x0;
        }
      }
      if ((l != (LOGGER_LOG)0x0) &&
         (source_message->application_properties != (application_properties)0x0)) {
        pAVar5 = amqpvalue_clone(source_message->application_properties);
        *(AMQP_VALUE *)(l + 0x48) = pAVar5;
        if (*(long *)(l + 0x48) == 0) {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message.c"
                      ,"message_clone",0xd7,1,"Cannot clone application annotations");
          }
          message_destroy((MESSAGE_HANDLE)l);
          l = (LOGGER_LOG)0x0;
        }
      }
      if ((l != (LOGGER_LOG)0x0) && (source_message->footer != (annotations)0x0)) {
        pAVar5 = amqpvalue_clone(source_message->footer);
        *(AMQP_VALUE *)(l + 0x50) = pAVar5;
        if (*(long *)(l + 0x50) == 0) {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message.c"
                      ,"message_clone",0xe4,1,"Cannot clone message footer");
          }
          message_destroy((MESSAGE_HANDLE)l);
          l = (LOGGER_LOG)0x0;
        }
      }
      if ((l != (LOGGER_LOG)0x0) && (source_message->body_amqp_data_count != 0)) {
        if (source_message->body_amqp_data_count == 0) {
          local_b8 = 0;
        }
        else {
          auVar1._8_8_ = 0;
          auVar1._0_8_ = source_message->body_amqp_data_count;
          if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar1,0) < 0x10) {
            local_c0 = 0xffffffffffffffff;
          }
          else {
            local_c0 = source_message->body_amqp_data_count << 4;
          }
          local_b8 = local_c0;
        }
        if (local_b8 == 0xffffffffffffffff) {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message.c"
                      ,"message_clone",0xf0,1,"Invalid size for body_amqp_data_items");
          }
          message_destroy((MESSAGE_HANDLE)l);
          l = (LOGGER_LOG)0x0;
        }
        else {
          pvVar7 = calloc(1,local_b8);
          *(void **)l = pvVar7;
          if (*(long *)l == 0) {
            p_Var3 = xlogging_get_log_function();
            if (p_Var3 != (LOGGER_LOG)0x0) {
              (*p_Var3)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message.c"
                        ,"message_clone",0xfb,1,"Cannot allocate memory for body data sections");
            }
            message_destroy((MESSAGE_HANDLE)l);
            l = (LOGGER_LOG)0x0;
          }
          else {
            for (l_10 = (LOGGER_LOG)0x0; l_10 < (LOGGER_LOG)source_message->body_amqp_data_count;
                l_10 = l_10 + 1) {
              *(size_t *)(*(long *)l + (long)l_10 * 0x10 + 8) =
                   source_message->body_amqp_data_items[(long)l_10].body_data_section_length;
              pvVar7 = malloc(source_message->body_amqp_data_items[(long)l_10].
                              body_data_section_length);
              *(void **)(*(long *)l + (long)l_10 * 0x10) = pvVar7;
              if (*(long *)(*(long *)l + (long)l_10 * 0x10) == 0) {
                p_Var3 = xlogging_get_log_function();
                if (p_Var3 != (LOGGER_LOG)0x0) {
                  (*p_Var3)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message.c"
                            ,"message_clone",0x10b,1,
                            "Cannot allocate memory for body data section %u",(int)l_10);
                }
                break;
              }
              memcpy(*(void **)(*(long *)l + (long)l_10 * 0x10),
                     source_message->body_amqp_data_items[(long)l_10].body_data_section_bytes,
                     *(size_t *)(*(long *)l + (long)l_10 * 0x10 + 8));
            }
            *(LOGGER_LOG *)(l + 8) = l_10;
            if (l_10 < (LOGGER_LOG)source_message->body_amqp_data_count) {
              message_destroy((MESSAGE_HANDLE)l);
              l = (LOGGER_LOG)0x0;
            }
          }
        }
      }
      if ((l != (LOGGER_LOG)0x0) && (source_message->body_amqp_sequence_count != 0)) {
        if (source_message->body_amqp_sequence_count == 0) {
          local_c8 = 0;
        }
        else {
          auVar2._8_8_ = 0;
          auVar2._0_8_ = source_message->body_amqp_sequence_count;
          if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar2,0) < 8) {
            local_d0 = 0xffffffffffffffff;
          }
          else {
            local_d0 = source_message->body_amqp_sequence_count << 3;
          }
          local_c8 = local_d0;
        }
        if (local_c8 == 0xffffffffffffffff) {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message.c"
                      ,"message_clone",0x125,1,"Invalid size for body_amqp_sequence_items");
          }
          message_destroy((MESSAGE_HANDLE)l);
          l = (LOGGER_LOG)0x0;
        }
        else {
          pvVar7 = calloc(1,local_c8);
          *(void **)(l + 0x10) = pvVar7;
          if (*(long *)(l + 0x10) == 0) {
            p_Var3 = xlogging_get_log_function();
            if (p_Var3 != (LOGGER_LOG)0x0) {
              (*p_Var3)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message.c"
                        ,"message_clone",0x12f,1,"Cannot allocate memory for body AMQP sequences");
            }
            message_destroy((MESSAGE_HANDLE)l);
            l = (LOGGER_LOG)0x0;
          }
          else {
            for (l_13 = (LOGGER_LOG)0x0; l_13 < (LOGGER_LOG)source_message->body_amqp_sequence_count
                ; l_13 = l_13 + 1) {
              pAVar5 = amqpvalue_clone(source_message->body_amqp_sequence_items[(long)l_13]);
              *(AMQP_VALUE *)(*(long *)(l + 0x10) + (long)l_13 * 8) = pAVar5;
              if (*(long *)(*(long *)(l + 0x10) + (long)l_13 * 8) == 0) {
                p_Var3 = xlogging_get_log_function();
                if (p_Var3 != (LOGGER_LOG)0x0) {
                  (*p_Var3)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message.c"
                            ,"message_clone",0x13d,1,"Cannot clone AMQP sequence %u",(int)l_13);
                }
                break;
              }
            }
            *(LOGGER_LOG *)(l + 0x18) = l_13;
            if (l_13 < (LOGGER_LOG)source_message->body_amqp_sequence_count) {
              message_destroy((MESSAGE_HANDLE)l);
              l = (LOGGER_LOG)0x0;
            }
          }
        }
      }
      if ((l != (LOGGER_LOG)0x0) && (source_message->body_amqp_value != (AMQP_VALUE)0x0)) {
        pAVar5 = amqpvalue_clone(source_message->body_amqp_value);
        *(AMQP_VALUE *)(l + 0x20) = pAVar5;
        if (*(long *)(l + 0x20) == 0) {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message.c"
                      ,"message_clone",0x154,1,"Cannot clone body AMQP value");
          }
          message_destroy((MESSAGE_HANDLE)l);
          l = (LOGGER_LOG)0x0;
        }
      }
    }
  }
  return (MESSAGE_HANDLE)l;
}

Assistant:

MESSAGE_HANDLE message_clone(MESSAGE_HANDLE source_message)
{
    MESSAGE_HANDLE result;

    if (source_message == NULL)
    {
        /* Codes_SRS_MESSAGE_01_062: [If `source_message` is NULL, `message_clone` shall fail and return NULL.] */
        LogError("NULL source_message");
        result = NULL;
    }
    else
    {
        /* Codes_SRS_MESSAGE_01_003: [`message_clone` shall clone a message entirely and on success return a non-NULL handle to the cloned message.] */
        result = (MESSAGE_HANDLE)message_create();
        if (result == NULL)
        {
            /* Codes_SRS_MESSAGE_01_004: [If allocating memory for the new cloned message fails, `message_clone` shall fail and return NULL.] */
            LogError("Cannot clone message");
        }
        else
        {
            result->message_format = source_message->message_format;

            if (source_message->header != NULL)
            {
                /* Codes_SRS_MESSAGE_01_005: [If a header exists on the source message it shall be cloned by using `header_clone`.] */
                result->header = header_clone(source_message->header);
                if (result->header == NULL)
                {
                    /* Codes_SRS_MESSAGE_01_012: [ If any cloning operation for the members of the source message fails, then `message_clone` shall fail and return NULL. ]*/
                    LogError("Cannot clone message header");
                    message_destroy(result);
                    result = NULL;
                }
            }

            if ((result != NULL) && (source_message->delivery_annotations != NULL))
            {
                /* Codes_SRS_MESSAGE_01_006: [If delivery annotations exist on the source message they shall be cloned by using `annotations_clone`.] */
                result->delivery_annotations = annotations_clone(source_message->delivery_annotations);
                if (result->delivery_annotations == NULL)
                {
                    /* Codes_SRS_MESSAGE_01_012: [ If any cloning operation for the members of the source message fails, then `message_clone` shall fail and return NULL. ]*/
                    LogError("Cannot clone delivery annotations");
                    message_destroy(result);
                    result = NULL;
                }
            }

            if ((result != NULL) && (source_message->message_annotations != NULL))
            {
                /* Codes_SRS_MESSAGE_01_007: [If message annotations exist on the source message they shall be cloned by using `annotations_clone`.] */
                result->message_annotations = annotations_clone(source_message->message_annotations);
                if (result->message_annotations == NULL)
                {
                    /* Codes_SRS_MESSAGE_01_012: [ If any cloning operation for the members of the source message fails, then `message_clone` shall fail and return NULL. ]*/
                    LogError("Cannot clone message annotations");
                    message_destroy(result);
                    result = NULL;
                }
            }

            if ((result != NULL) && (source_message->properties != NULL))
            {
                /* Codes_SRS_MESSAGE_01_008: [If message properties exist on the source message they shall be cloned by using `properties_clone`.] */
                result->properties = properties_clone(source_message->properties);
                if (result->properties == NULL)
                {
                    /* Codes_SRS_MESSAGE_01_012: [ If any cloning operation for the members of the source message fails, then `message_clone` shall fail and return NULL. ]*/
                    LogError("Cannot clone message properties");
                    message_destroy(result);
                    result = NULL;
                }
            }

            if ((result != NULL) && (source_message->application_properties != NULL))
            {
                /* Codes_SRS_MESSAGE_01_009: [If application properties exist on the source message they shall be cloned by using `amqpvalue_clone`.] */
                result->application_properties = amqpvalue_clone(source_message->application_properties);
                if (result->application_properties == NULL)
                {
                    /* Codes_SRS_MESSAGE_01_012: [ If any cloning operation for the members of the source message fails, then `message_clone` shall fail and return NULL. ]*/
                    LogError("Cannot clone application annotations");
                    message_destroy(result);
                    result = NULL;
                }
            }

            if ((result != NULL) && (source_message->footer != NULL))
            {
                /* Codes_SRS_MESSAGE_01_010: [If a footer exists on the source message it shall be cloned by using `annotations_clone`.] */
                result->footer = amqpvalue_clone(source_message->footer);
                if (result->footer == NULL)
                {
                    /* Codes_SRS_MESSAGE_01_012: [ If any cloning operation for the members of the source message fails, then `message_clone` shall fail and return NULL. ]*/
                    LogError("Cannot clone message footer");
                    message_destroy(result);
                    result = NULL;
                }
            }

            if ((result != NULL) && (source_message->body_amqp_data_count > 0))
            {
                size_t calloc_size = safe_multiply_size_t(source_message->body_amqp_data_count, sizeof(BODY_AMQP_DATA));

                if (calloc_size == SIZE_MAX)
                {
                    LogError("Invalid size for body_amqp_data_items");
                    message_destroy(result);
                    result = NULL;
                }
                else
                {
                    result->body_amqp_data_items = (BODY_AMQP_DATA*)calloc(1, calloc_size);

                    if (result->body_amqp_data_items == NULL)
                    {
                        /* Codes_SRS_MESSAGE_01_012: [ If any cloning operation for the members of the source message fails, then `message_clone` shall fail and return NULL. ]*/
                        LogError("Cannot allocate memory for body data sections");
                        message_destroy(result);
                        result = NULL;
                    }
                    else
                    {
                        size_t i;

                        for (i = 0; i < source_message->body_amqp_data_count; i++)
                        {
                            result->body_amqp_data_items[i].body_data_section_length = source_message->body_amqp_data_items[i].body_data_section_length;

                            /* Codes_SRS_MESSAGE_01_011: [If an AMQP data has been set as message body on the source message it shall be cloned by allocating memory for the binary payload.] */
                            result->body_amqp_data_items[i].body_data_section_bytes = (unsigned char*)malloc(source_message->body_amqp_data_items[i].body_data_section_length);
                            if (result->body_amqp_data_items[i].body_data_section_bytes == NULL)
                            {
                                LogError("Cannot allocate memory for body data section %u", (unsigned int)i);
                                break;
                            }
                            else
                            {
                                (void)memcpy(result->body_amqp_data_items[i].body_data_section_bytes, source_message->body_amqp_data_items[i].body_data_section_bytes, result->body_amqp_data_items[i].body_data_section_length);
                            }
                        }

                        result->body_amqp_data_count = i;
                        if (i < source_message->body_amqp_data_count)
                        {
                            /* Codes_SRS_MESSAGE_01_012: [ If any cloning operation for the members of the source message fails, then `message_clone` shall fail and return NULL. ]*/
                            message_destroy(result);
                            result = NULL;
                        }
                    }
                }
            }

            if ((result != NULL) && (source_message->body_amqp_sequence_count > 0))
            {
                size_t calloc_size = safe_multiply_size_t(source_message->body_amqp_sequence_count, sizeof(AMQP_VALUE));

                if (calloc_size == SIZE_MAX)
                {
                    LogError("Invalid size for body_amqp_sequence_items");
                    message_destroy(result);
                    result = NULL;
                }
                else
                {
                    result->body_amqp_sequence_items = (AMQP_VALUE*)calloc(1, calloc_size);
                    if (result->body_amqp_sequence_items == NULL)
                    {
                        /* Codes_SRS_MESSAGE_01_012: [ If any cloning operation for the members of the source message fails, then `message_clone` shall fail and return NULL. ]*/
                        LogError("Cannot allocate memory for body AMQP sequences");
                        message_destroy(result);
                        result = NULL;
                    }
                    else
                    {
                        size_t i;

                        for (i = 0; i < source_message->body_amqp_sequence_count; i++)
                        {
                            /* Codes_SRS_MESSAGE_01_160: [ If AMQP sequences are set as AMQP body they shall be cloned by calling `amqpvalue_clone`. ] */
                            result->body_amqp_sequence_items[i] = amqpvalue_clone(source_message->body_amqp_sequence_items[i]);
                            if (result->body_amqp_sequence_items[i] == NULL)
                            {
                                LogError("Cannot clone AMQP sequence %u", (unsigned int)i);
                                break;
                            }
                        }

                        result->body_amqp_sequence_count = i;
                        if (i < source_message->body_amqp_sequence_count)
                        {
                            /* Codes_SRS_MESSAGE_01_012: [ If any cloning operation for the members of the source message fails, then `message_clone` shall fail and return NULL. ]*/
                            message_destroy(result);
                            result = NULL;
                        }
                    }
				}
            }

            if ((result != NULL) && (source_message->body_amqp_value != NULL))
            {
                /* Codes_SRS_MESSAGE_01_159: [If an AMQP value has been set as message body on the source message it shall be cloned by calling `amqpvalue_clone`. ]*/
                result->body_amqp_value = amqpvalue_clone(source_message->body_amqp_value);
                if (result->body_amqp_value == NULL)
                {
                    /* Codes_SRS_MESSAGE_01_012: [ If any cloning operation for the members of the source message fails, then `message_clone` shall fail and return NULL. ]*/
                    LogError("Cannot clone body AMQP value");
                    message_destroy(result);
                    result = NULL;
                }
            }
        }
    }

    return result;
}